

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_impl_is_square_var(secp256k1_fe *x)

{
  int iVar1;
  void *in_RDI;
  secp256k1_modinv64_modinfo *unaff_retaddr;
  secp256k1_fe dummy;
  int ret;
  int jac;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe tmp;
  secp256k1_fe *in_stack_00000198;
  secp256k1_fe *in_stack_000001a0;
  uint local_70;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_fe local_40;
  uint local_4;
  
  memcpy(&local_40,in_RDI,0x30);
  secp256k1_fe_normalize_var((secp256k1_fe *)0x123160);
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x12316a);
  if (iVar1 == 0) {
    secp256k1_fe_to_signed62(&local_68,&local_40);
    iVar1 = secp256k1_jacobi64_maybe_var((secp256k1_modinv64_signed62 *)dummy.n[0],unaff_retaddr);
    if (iVar1 == 0) {
      local_70 = secp256k1_fe_sqrt(in_stack_000001a0,in_stack_00000198);
    }
    else {
      local_70 = (uint)(-1 < iVar1);
    }
    local_4 = local_70;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int secp256k1_fe_impl_is_square_var(const secp256k1_fe *x) {
    secp256k1_fe tmp;
    secp256k1_modinv64_signed62 s;
    int jac, ret;

    tmp = *x;
    secp256k1_fe_normalize_var(&tmp);
    /* secp256k1_jacobi64_maybe_var cannot deal with input 0. */
    if (secp256k1_fe_is_zero(&tmp)) return 1;
    secp256k1_fe_to_signed62(&s, &tmp);
    jac = secp256k1_jacobi64_maybe_var(&s, &secp256k1_const_modinfo_fe);
    if (jac == 0) {
        /* secp256k1_jacobi64_maybe_var failed to compute the Jacobi symbol. Fall back
         * to computing a square root. This should be extremely rare with random
         * input (except in VERIFY mode, where a lower iteration count is used). */
        secp256k1_fe dummy;
        ret = secp256k1_fe_sqrt(&dummy, &tmp);
    } else {
        ret = jac >= 0;
    }
    return ret;
}